

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O0

string * __thiscall
vkt::pipeline::(anonymous_namespace)::CacheTestParam::generateTestDescription_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  bool in_CL;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  uint local_50;
  deUint32 ndx;
  string local_40;
  undefined1 local_19;
  void *local_18;
  CacheTestParam *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (CacheTestParam *)__return_storage_ptr__;
  getShaderFlagStr_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)(ulong)*(uint *)((long)this + 8),
             VK_SHADER_STAGE_VERTEX_BIT,in_CL);
  std::operator+(__return_storage_ptr__,"Create pipeline cache with ",&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  for (local_50 = 1; (ulong)local_50 < *(ulong *)((long)this + 0x20); local_50 = local_50 + 1) {
    getShaderFlagStr_abi_cxx11_
              (&local_90,
               (_anonymous_namespace_ *)(ulong)*(uint *)((long)this + (ulong)local_50 * 4 + 8),
               VK_SHADER_STAGE_VERTEX_BIT,SUB41(local_50,0));
    std::operator+(&local_70,' ',&local_90);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string CacheTestParam::generateTestDescription (void) const
{
	std::string result("Create pipeline cache with " + getShaderFlagStr(m_shaders[0], true));

	for(deUint32 ndx = 1; ndx < m_shaderCount; ndx++)
		result += ' ' + getShaderFlagStr(m_shaders[ndx], true);

	return result;
}